

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O0

DataBuffer * __thiscall ProtocolMACEthernet::GetTxBuffer(ProtocolMACEthernet *this)

{
  DataBuffer *this_00;
  size_t sVar1;
  DataBuffer *buffer;
  ProtocolMACEthernet *this_local;
  
  while( true ) {
    this_00 = (DataBuffer *)osQueue::Get(&this->TxBufferQueue);
    if (this_00 != (DataBuffer *)0x0) break;
    osEvent::Wait(&this->QueueEmptyEvent,
                  "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/ProtocolMACEthernet.cpp"
                  ,0x9d,-1);
  }
  if (this_00 != (DataBuffer *)0x0) {
    DataBuffer::Initialize(this_00,&this->super_InterfaceMAC);
    sVar1 = header_size();
    this_00->Packet = this_00->Packet + sVar1;
    sVar1 = header_size();
    this_00->Remainder = this_00->Remainder - (short)sVar1;
  }
  return this_00;
}

Assistant:

DataBuffer* ProtocolMACEthernet::GetTxBuffer()
{
    DataBuffer* buffer;

    while ((buffer = (DataBuffer*)TxBufferQueue.Get()) == nullptr)
    {
        QueueEmptyEvent.Wait(__FILE__, __LINE__);
    }
    if (buffer != nullptr)
    {
        buffer->Initialize(this);
        buffer->Packet += header_size();
        buffer->Remainder -= header_size();
    }

    return buffer;
}